

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O2

bool __thiscall helics::fileops::looksLikeConfigJson(fileops *this,string_view jsonString)

{
  size_type sVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> jsonString_00;
  string_view sVar3;
  string_view local_18;
  
  local_18._M_str = (char *)jsonString._M_len;
  local_18._M_len = (size_t)this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_18,"\n#",0);
  if (sVar1 != 0xffffffffffffffff) {
    return false;
  }
  local_18 = removeSpaceAndComment(local_18);
  if ((6 < local_18._M_len) && (*local_18._M_str == '{')) {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(&local_18,"\"\'",0)
    ;
    if (sVar1 == 0xffffffffffffffff) {
      return false;
    }
    sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_18,':',0);
    if (sVar2 == 0xffffffffffffffff) {
      return false;
    }
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                      (&local_18,'}',0xffffffffffffffff);
    if (sVar1 != 0xffffffffffffffff) {
      jsonString_00 =
           CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)&local_18,sVar1 + 1,
                      0xffffffffffffffff);
      sVar3 = removeSpaceAndComment((string_view)jsonString_00);
      return sVar3._M_len == 0;
    }
  }
  return false;
}

Assistant:

bool looksLikeConfigJson(std::string_view jsonString)
{
    if (jsonString.find("\n#") != std::string_view::npos) {
        return false;
    }
    jsonString = removeSpaceAndComment(jsonString);
    if (jsonString.size() < 7) {
        // minimum viable config file is 7 characters {"f":4}
        return false;
    }

    if (jsonString.front() != '{') {
        return false;
    }
    auto firstQuote = jsonString.find_first_of("\"'");
    if (firstQuote == std::string_view::npos) {
        return false;
    }
    auto firstColonLoc = jsonString.find_first_of(':');
    if (firstColonLoc == std::string_view::npos) {
        return false;
    }
    auto closeBracket = jsonString.find_last_of('}');
    if (closeBracket == std::string_view::npos) {
        return false;
    }

    auto afterBracket = removeSpaceAndComment(jsonString.substr(closeBracket + 1));
    return afterBracket.empty();
}